

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::GetData
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,BufferImplType **pSBTBuffer,
          BindingTable *RaygenShaderBindingTable,BindingTable *MissShaderBindingTable,
          BindingTable *HitShaderBindingTable,BindingTable *CallableShaderBindingTable)

{
  char *pcVar1;
  bool bVar2;
  Uint32 UVar3;
  Uint32 UVar4;
  Uint32 UVar5;
  RenderDeviceVkImpl *pRVar6;
  GraphicsAdapterInfo *pGVar7;
  size_type sVar8;
  BufferVkImpl *pBVar9;
  BufferDesc *pBVar10;
  char (*Args_1) [21];
  Char *Message;
  uchar *local_168;
  uchar *local_160;
  uchar *local_158;
  uchar *local_150;
  undefined1 local_108 [8];
  string msg;
  undefined1 local_d8 [8];
  BufferDesc BuffDesc;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  String BuffName;
  Uint32 BufSize;
  Uint32 CallableShadersOffset;
  Uint32 HitGroupOffset;
  Uint32 MissShaderOffset;
  Uint32 RayGenOffset;
  anon_class_4_1_6f206636 AlignToLarger;
  Uint32 ShaderGroupBaseAlignment;
  BindingTable *CallableShaderBindingTable_local;
  BindingTable *HitShaderBindingTable_local;
  BindingTable *MissShaderBindingTable_local;
  BindingTable *RaygenShaderBindingTable_local;
  BufferImplType **pSBTBuffer_local;
  ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this_local;
  
  _AlignToLarger = CallableShaderBindingTable;
  pRVar6 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  pGVar7 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar6);
  MissShaderOffset = (pGVar7->RayTracing).ShaderGroupBaseAlignment;
  RayGenOffset = MissShaderOffset;
  sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->m_RayGenShaderRecord);
  UVar3 = GetData::anon_class_4_1_6f206636::operator()
                    ((anon_class_4_1_6f206636 *)&MissShaderOffset,sVar8);
  sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->m_MissShadersRecord);
  UVar4 = GetData::anon_class_4_1_6f206636::operator()
                    ((anon_class_4_1_6f206636 *)&MissShaderOffset,UVar3 + sVar8);
  sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_HitGroupsRecord)
  ;
  UVar5 = GetData::anon_class_4_1_6f206636::operator()
                    ((anon_class_4_1_6f206636 *)&MissShaderOffset,UVar4 + sVar8);
  sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->m_CallableShadersRecord);
  BuffName.field_2._12_4_ =
       GetData::anon_class_4_1_6f206636::operator()
                 ((anon_class_4_1_6f206636 *)&MissShaderOffset,UVar5 + sVar8);
  pBVar9 = Diligent::RefCntAutoPtr::operator_cast_to_BufferVkImpl_
                     ((RefCntAutoPtr *)&this->m_pBuffer);
  if (pBVar9 != (BufferVkImpl *)0x0) {
    pBVar9 = RefCntAutoPtr<Diligent::BufferVkImpl>::operator->(&this->m_pBuffer);
    pBVar10 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                         *)pBVar9);
    if ((ulong)(uint)BuffName.field_2._12_4_ <= pBVar10->Size) goto LAB_0036620c;
  }
  RefCntAutoPtr<Diligent::BufferVkImpl>::operator=(&this->m_pBuffer,(BufferVkImpl *)0x0);
  pcVar1 = (this->
           super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ).m_Desc.super_DeviceObjectAttribs.Name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,pcVar1,&local_99);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &local_98," - internal buffer");
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  BufferDesc::BufferDesc((BufferDesc *)local_d8);
  local_d8 = (undefined1  [8])std::__cxx11::string::c_str();
  BuffDesc.Size._4_1_ = 1;
  BuffDesc.Size._0_4_ = 0x400;
  BuffDesc.super_DeviceObjectAttribs.Name = (Char *)(ulong)(uint)BuffName.field_2._12_4_;
  pRVar6 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  RefCntAutoPtr<Diligent::BufferVkImpl>::DblPtr<Diligent::IBuffer,void>
            ((RefCntAutoPtr<Diligent::BufferVkImpl> *)(msg.field_2._M_local_buf + 8));
  Args_1 = (char (*) [21])
           Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_IBuffer__
                     ((DoublePtrHelper *)(msg.field_2._M_local_buf + 8));
  RenderDeviceVkImpl::CreateBuffer
            (pRVar6,(BufferDesc *)local_d8,(BufferData *)0x0,(IBuffer **)Args_1);
  RefCntAutoPtr<Diligent::BufferVkImpl>::DoublePtrHelper<Diligent::IBuffer>::~DoublePtrHelper
            ((DoublePtrHelper<Diligent::IBuffer> *)((long)&msg.field_2 + 8));
  pBVar9 = Diligent::RefCntAutoPtr::operator_cast_to_BufferVkImpl_
                     ((RefCntAutoPtr *)&this->m_pBuffer);
  if (pBVar9 == (BufferVkImpl *)0x0) {
    FormatString<char[26],char[21]>
              ((string *)local_108,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pBuffer != nullptr",Args_1);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x1dd);
    std::__cxx11::string::~string((string *)local_108);
  }
  std::__cxx11::string::~string((string *)local_78);
LAB_0036620c:
  pBVar9 = Diligent::RefCntAutoPtr::operator_cast_to_BufferVkImpl_
                     ((RefCntAutoPtr *)&this->m_pBuffer);
  if (pBVar9 != (BufferVkImpl *)0x0) {
    pBVar9 = Diligent::RefCntAutoPtr::operator_cast_to_BufferVkImpl_
                       ((RefCntAutoPtr *)&this->m_pBuffer);
    *pSBTBuffer = pBVar9;
    bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      (&this->m_RayGenShaderRecord);
    if (!bVar2) {
      if ((this->m_Changed & 1U) == 0) {
        local_150 = (uchar *)0x0;
      }
      else {
        local_150 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              (&this->m_RayGenShaderRecord);
      }
      RaygenShaderBindingTable->pData = local_150;
      RaygenShaderBindingTable->Offset = 0;
      sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_RayGenShaderRecord);
      RaygenShaderBindingTable->Size = (Uint32)sVar8;
      RaygenShaderBindingTable->Stride = this->m_ShaderRecordStride;
    }
    bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      (&this->m_MissShadersRecord);
    if (!bVar2) {
      if ((this->m_Changed & 1U) == 0) {
        local_158 = (uchar *)0x0;
      }
      else {
        local_158 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              (&this->m_MissShadersRecord);
      }
      MissShaderBindingTable->pData = local_158;
      MissShaderBindingTable->Offset = UVar3;
      sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_MissShadersRecord);
      MissShaderBindingTable->Size = (Uint32)sVar8;
      MissShaderBindingTable->Stride = this->m_ShaderRecordStride;
    }
    bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      (&this->m_HitGroupsRecord);
    if (!bVar2) {
      if ((this->m_Changed & 1U) == 0) {
        local_160 = (uchar *)0x0;
      }
      else {
        local_160 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              (&this->m_HitGroupsRecord);
      }
      HitShaderBindingTable->pData = local_160;
      HitShaderBindingTable->Offset = UVar4;
      sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_HitGroupsRecord);
      HitShaderBindingTable->Size = (Uint32)sVar8;
      HitShaderBindingTable->Stride = this->m_ShaderRecordStride;
    }
    bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      (&this->m_CallableShadersRecord);
    if (!bVar2) {
      if ((this->m_Changed & 1U) == 0) {
        local_168 = (uchar *)0x0;
      }
      else {
        local_168 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              (&this->m_CallableShadersRecord);
      }
      _AlignToLarger->pData = local_168;
      _AlignToLarger->Offset = UVar5;
      sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_CallableShadersRecord);
      _AlignToLarger->Size = (Uint32)sVar8;
      _AlignToLarger->Stride = this->m_ShaderRecordStride;
    }
    this->m_Changed = false;
  }
  return;
}

Assistant:

void GetData(BufferImplType*& pSBTBuffer,
                 BindingTable&    RaygenShaderBindingTable,
                 BindingTable&    MissShaderBindingTable,
                 BindingTable&    HitShaderBindingTable,
                 BindingTable&    CallableShaderBindingTable)
    {
        const Uint32 ShaderGroupBaseAlignment = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupBaseAlignment;

        const auto AlignToLarger = [ShaderGroupBaseAlignment](size_t offset) -> Uint32 {
            return AlignUp(static_cast<Uint32>(offset), ShaderGroupBaseAlignment);
        };

        const Uint32 RayGenOffset          = 0;
        const Uint32 MissShaderOffset      = AlignToLarger(m_RayGenShaderRecord.size());
        const Uint32 HitGroupOffset        = AlignToLarger(MissShaderOffset + m_MissShadersRecord.size());
        const Uint32 CallableShadersOffset = AlignToLarger(HitGroupOffset + m_HitGroupsRecord.size());
        const Uint32 BufSize               = AlignToLarger(CallableShadersOffset + m_CallableShadersRecord.size());

        // Recreate buffer
        if (m_pBuffer == nullptr || m_pBuffer->GetDesc().Size < BufSize)
        {
            m_pBuffer = nullptr;

            String     BuffName = String{this->m_Desc.Name} + " - internal buffer";
            BufferDesc BuffDesc;
            BuffDesc.Name      = BuffName.c_str();
            BuffDesc.Usage     = USAGE_DEFAULT;
            BuffDesc.BindFlags = BIND_RAY_TRACING;
            BuffDesc.Size      = BufSize;

            this->GetDevice()->CreateBuffer(BuffDesc, nullptr, m_pBuffer.template DblPtr<IBuffer>());
            VERIFY_EXPR(m_pBuffer != nullptr);
        }

        if (m_pBuffer == nullptr)
            return; // Something went wrong

        pSBTBuffer = m_pBuffer;

        if (!m_RayGenShaderRecord.empty())
        {
            RaygenShaderBindingTable.pData  = m_Changed ? m_RayGenShaderRecord.data() : nullptr;
            RaygenShaderBindingTable.Offset = RayGenOffset;
            RaygenShaderBindingTable.Size   = static_cast<Uint32>(m_RayGenShaderRecord.size());
            RaygenShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        if (!m_MissShadersRecord.empty())
        {
            MissShaderBindingTable.pData  = m_Changed ? m_MissShadersRecord.data() : nullptr;
            MissShaderBindingTable.Offset = MissShaderOffset;
            MissShaderBindingTable.Size   = static_cast<Uint32>(m_MissShadersRecord.size());
            MissShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        if (!m_HitGroupsRecord.empty())
        {
            HitShaderBindingTable.pData  = m_Changed ? m_HitGroupsRecord.data() : nullptr;
            HitShaderBindingTable.Offset = HitGroupOffset;
            HitShaderBindingTable.Size   = static_cast<Uint32>(m_HitGroupsRecord.size());
            HitShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        if (!m_CallableShadersRecord.empty())
        {
            CallableShaderBindingTable.pData  = m_Changed ? m_CallableShadersRecord.data() : nullptr;
            CallableShaderBindingTable.Offset = CallableShadersOffset;
            CallableShaderBindingTable.Size   = static_cast<Uint32>(m_CallableShadersRecord.size());
            CallableShaderBindingTable.Stride = this->m_ShaderRecordStride;
        }

        m_Changed = false;
    }